

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::~SmallHeapBlockT
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  uint32 *puVar1;
  size_t *psVar2;
  HeapBlockType HVar3;
  HeapBucket *pHVar4;
  code *pcVar5;
  bool bVar6;
  IdleDecommitPageAllocator *pIVar7;
  undefined4 *puVar8;
  
  (this->super_HeapBlock)._vptr_HeapBlock = (_func_int **)&PTR_WBSetBit_014d9248;
  if ((((this->super_HeapBlock).address != (char *)0x0 ||
        (this->super_HeapBlock).segment != (Segment *)0x0) &&
      (HVar3 = (this->super_HeapBlock).heapBlockType, HVar3 != SmallLeafBlockType)) &&
     (HVar3 != MediumLeafBlockType)) {
    pIVar7 = GetPageAllocator(this);
    if ((pIVar7->super_PageAllocator).isClosed == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0x92,
                         "((this->segment == nullptr && this->address == nullptr) || (this->IsLeafBlock()) || this->GetPageAllocator()->IsClosed())"
                         ,
                         "(this->segment == nullptr && this->address == nullptr) || (this->IsLeafBlock()) || this->GetPageAllocator()->IsClosed()"
                        );
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
  }
  pHVar4 = this->heapBucket;
  psVar2 = pHVar4->heapInfo->heapBlockCount + (this->super_HeapBlock).heapBlockType;
  *psVar2 = *psVar2 - 1;
  puVar1 = &pHVar4->heapBlockCount;
  *puVar1 = *puVar1 - 1;
  return;
}

Assistant:

SmallHeapBlockT<TBlockAttributes>::~SmallHeapBlockT()
{
    Assert((this->segment == nullptr && this->address == nullptr) ||
        (this->IsLeafBlock()) ||
        this->GetPageAllocator()->IsClosed());

#if defined(RECYCLER_SLOW_CHECK_ENABLED)
    heapBucket->heapInfo->heapBlockCount[this->GetHeapBlockType()]--;
#endif

#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    heapBucket->heapBlockCount--;
#endif
}